

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsWebServer.cpp
# Opt level: O0

string * generateIndexPage_abi_cxx11_(void)

{
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  string *index;
  string *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  undefined7 in_stack_fffffffffffffff0;
  undefined1 uVar1;
  string *__s_00;
  
  uVar1 = 0;
  __s = in_RDI;
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         helics::webserver::indexPage1;
  __s_00 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (unaff_retaddr,(char *)__s_00,
             (allocator<char> *)CONCAT17(uVar1,in_stack_fffffffffffffff0));
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffff6);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (this,(char *)__s);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (this,(char *)__s);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (this,(char *)__s);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (this,(char *)__s);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (this,(char *)__s);
  return in_RDI;
}

Assistant:

static std::string generateIndexPage()
{
    std::string index = helics::webserver::indexPage1;
    index.append(helics::webserver::style);
    index.append(helics::webserver::indexPage2);
    index.append(helics::webserver::svg1);
    index.append(helics::webserver::svg2);
    index.append(helics::webserver::indexPage3);
    return index;
}